

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall
kj::
Table<kj::HashMap<kj::String,_int>::Entry,_kj::HashIndex<kj::HashMap<kj::String,_int>::Callbacks>_>
::eraseImpl(Table<kj::HashMap<kj::String,_int>::Entry,_kj::HashIndex<kj::HashMap<kj::String,_int>::Callbacks>_>
            *this,size_t pos)

{
  size_t oldPos;
  
  Impl<0UL,_false>::erase
            ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
             this,pos,(StringPtr *)(*(long *)this + pos * 0x20));
  oldPos = (*(long *)(this + 8) - *(long *)this >> 5) - 1;
  if (oldPos != pos) {
    Impl<0UL,_false>::move
              ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
               this,oldPos,pos,(StringPtr *)(*(long *)this + oldPos * 0x20));
    HashMap<kj::String,_int>::Entry::operator=
              ((Entry *)(pos * 0x20 + *(long *)this),(StringPtr *)(oldPos * 0x20 + *(long *)this));
  }
  ArrayBuilder<kj::HashMap<kj::String,_int>::Entry>::removeLast
            ((ArrayBuilder<kj::HashMap<kj::String,_int>::Entry> *)this);
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}